

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

void take_line(Env *env)

{
  _Bool _Var1;
  byte local_11;
  Env *env_local;
  
  while( true ) {
    _Var1 = not_eof(env);
    local_11 = 0;
    if (_Var1) {
      _Var1 = is_newline(env->lexer->lookahead);
      local_11 = _Var1 ^ 0xff;
    }
    if ((local_11 & 1) == 0) break;
    advance(env);
  }
  return;
}

Assistant:

static void take_line(Env *env) {
  while (not_eof(env) && !is_newline(PEEK)) S_ADVANCE;
}